

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void fts3OptimizeFunc(sqlite3_context *pContext,int nVal,sqlite3_value **apVal)

{
  long lVar1;
  int iVar2;
  char *in_RDX;
  undefined4 in_ESI;
  long in_FS_OFFSET;
  Fts3Table *p;
  int rc;
  Fts3Cursor *pCursor;
  undefined4 in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffbc;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  char *z;
  uint in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffe0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  iVar2 = fts3FunctionArg((sqlite3_context *)CONCAT44(in_ESI,in_stack_ffffffffffffffe0),in_RDX,
                          (sqlite3_value *)CONCAT44(0xaaaaaaaa,in_stack_ffffffffffffffd0),
                          (Fts3Cursor **)&DAT_aaaaaaaaaaaaaaaa);
  if (iVar2 == 0) {
    z = _DAT_aaaaaaaaaaaaaaaa;
    iVar2 = sqlite3Fts3Optimize((Fts3Table *)
                                CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
    if (iVar2 == 0) {
      sqlite3_result_text((sqlite3_context *)(ulong)in_stack_ffffffffffffffd0,z,0,
                          (_func_void_void_ptr *)
                          CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
    }
    else if (iVar2 == 0x65) {
      sqlite3_result_text((sqlite3_context *)CONCAT44(0x65,in_stack_ffffffffffffffd0),z,0x65,
                          (_func_void_void_ptr *)
                          CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
    }
    else {
      sqlite3_result_error_code
                ((sqlite3_context *)CONCAT44(iVar2,in_stack_ffffffffffffffc0),
                 in_stack_ffffffffffffffbc);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

static void fts3OptimizeFunc(
  sqlite3_context *pContext,      /* SQLite function call context */
  int nVal,                       /* Size of argument array */
  sqlite3_value **apVal           /* Array of arguments */
){
  int rc;                         /* Return code */
  Fts3Table *p;                   /* Virtual table handle */
  Fts3Cursor *pCursor;            /* Cursor handle passed through apVal[0] */

  UNUSED_PARAMETER(nVal);

  assert( nVal==1 );
  if( fts3FunctionArg(pContext, "optimize", apVal[0], &pCursor) ) return;
  p = (Fts3Table *)pCursor->base.pVtab;
  assert( p );

  rc = sqlite3Fts3Optimize(p);

  switch( rc ){
    case SQLITE_OK:
      sqlite3_result_text(pContext, "Index optimized", -1, SQLITE_STATIC);
      break;
    case SQLITE_DONE:
      sqlite3_result_text(pContext, "Index already optimal", -1, SQLITE_STATIC);
      break;
    default:
      sqlite3_result_error_code(pContext, rc);
      break;
  }
}